

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*>::
emplaceRealloc<slang::syntax::LocalVariableDeclarationSyntax*>
          (SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*> *this,pointer pos,
          LocalVariableDeclarationSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppLVar3;
  LocalVariableDeclarationSyntax **__result;
  LocalVariableDeclarationSyntax **ppLVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  LocalVariableDeclarationSyntax **args_local;
  pointer pos_local;
  SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::calculateGrowth
                       ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppLVar3 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::begin
                      ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
  __result = (LocalVariableDeclarationSyntax **)slang::detail::allocArray(capacity,8);
  ppLVar4 = __result + ((long)pos - (long)ppLVar3 >> 3);
  *ppLVar4 = *args;
  ppLVar3 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::end
                      ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
  if (pos == ppLVar3) {
    ppLVar3 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::LocalVariableDeclarationSyntax**,slang::syntax::LocalVariableDeclarationSyntax**>
              (ppLVar3,(LocalVariableDeclarationSyntax **)ctx,__result);
  }
  else {
    ppLVar3 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::LocalVariableDeclarationSyntax**,slang::syntax::LocalVariableDeclarationSyntax**>
              (ppLVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::LocalVariableDeclarationSyntax**,slang::syntax::LocalVariableDeclarationSyntax**>
              (pos,(LocalVariableDeclarationSyntax **)ctx,ppLVar4 + 1);
  }
  SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::cleanup
            ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(LocalVariableDeclarationSyntax ***)this = __result;
  return ppLVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}